

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

char * libj1939_ifnam(int ifindex)

{
  if_nameindex *piVar1;
  uint in_EDI;
  if_nameindex *cached;
  if_nameindex *lp;
  if_nameindex *piVar2;
  char *local_8;
  
  piVar1 = saved;
  fetch_names();
  piVar2 = saved;
  while( true ) {
    if (piVar2->if_index == 0) {
      if (piVar1 == (if_nameindex *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        libj1939_cleanup();
        local_8 = libj1939_ifnam((int)((ulong)piVar2 >> 0x20));
      }
      return local_8;
    }
    if (piVar2->if_index == in_EDI) break;
    piVar2 = piVar2 + 1;
  }
  return piVar2->if_name;
}

Assistant:

static const char *libj1939_ifnam(int ifindex)
{
	const struct if_nameindex *lp, *cached = saved;

	fetch_names();

	for (lp = saved; lp->if_index; ++lp) {
		if (lp->if_index == (unsigned int)ifindex)
			return lp->if_name;
	}
	if (cached) {
		/*
		 * the list was not recent
		 * iterate twice, but force a refresh now
		 * recursion stops since the 'saved' pointer is cleaned
		 */
		libj1939_cleanup();
		return libj1939_ifnam(ifindex);
	}
	return NULL;
}